

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O0

void __thiscall
Path::stroke(Path *this,vector<Shape,_std::allocator<Shape>_> *shapes,float width,
            shared_ptr<Paint> *paint)

{
  ulong uVar1;
  bool bVar2;
  reference shape_00;
  reference pSVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  float offset_00;
  size_type local_c0;
  size_t i_1;
  pointer pPStack_b0;
  pointer local_a8;
  undefined8 uStack_a0;
  ulong local_88;
  size_t i;
  Subpath new_subpath;
  vector<Point,_std::allocator<Point>_> *points;
  Subpath *subpath;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Subpath,_std::allocator<Subpath>_> *__range1;
  float offset;
  Shape *shape;
  shared_ptr<Paint> *paint_local;
  float width_local;
  vector<Shape,_std::allocator<Shape>_> *shapes_local;
  Path *this_local;
  
  std::vector<Shape,std::allocator<Shape>>::emplace_back<std::shared_ptr<Paint>const&>
            ((vector<Shape,std::allocator<Shape>> *)shapes,paint);
  shape_00 = std::vector<Shape,_std::allocator<Shape>_>::back(shapes);
  offset_00 = width / 2.0;
  __end1 = std::vector<Subpath,_std::allocator<Subpath>_>::begin(&this->subpaths);
  subpath = (Subpath *)std::vector<Subpath,_std::allocator<Subpath>_>::end(&this->subpaths);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Subpath_*,_std::vector<Subpath,_std::allocator<Subpath>_>_>
                                *)&subpath);
    if (!bVar2) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_Subpath_*,_std::vector<Subpath,_std::allocator<Subpath>_>_>::
             operator*(&__end1);
    new_subpath._24_8_ = pSVar3;
    Subpath::Subpath((Subpath *)&i);
    local_88 = 1;
    while( true ) {
      uVar1 = local_88;
      sVar4 = std::vector<Point,_std::allocator<Point>_>::size
                        ((vector<Point,_std::allocator<Point>_> *)new_subpath._24_8_);
      if (sVar4 <= uVar1) break;
      pvVar5 = std::vector<Point,_std::allocator<Point>_>::operator[]
                         ((vector<Point,_std::allocator<Point>_> *)new_subpath._24_8_,local_88 - 1);
      pvVar6 = std::vector<Point,_std::allocator<Point>_>::operator[]
                         ((vector<Point,_std::allocator<Point>_> *)new_subpath._24_8_,local_88);
      Subpath::push_offset_segment((Subpath *)&i,pvVar5,pvVar6,offset_00);
      local_88 = local_88 + 1;
    }
    if ((pSVar3->closed & 1U) != 0) {
      pvVar5 = std::vector<Point,_std::allocator<Point>_>::back
                         ((vector<Point,_std::allocator<Point>_> *)new_subpath._24_8_);
      pvVar6 = std::vector<Point,_std::allocator<Point>_>::front
                         ((vector<Point,_std::allocator<Point>_> *)new_subpath._24_8_);
      Subpath::push_offset_segment((Subpath *)&i,pvVar5,pvVar6,offset_00);
      new_subpath.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
      fill_subpath(this,(Subpath *)&i,shape_00);
      local_a8 = (pointer)0x0;
      uStack_a0._0_1_ = false;
      uStack_a0._1_7_ = 0;
      i_1 = 0;
      pPStack_b0 = (pointer)0x0;
      Subpath::Subpath((Subpath *)&i_1);
      Subpath::operator=((Subpath *)&i,(Subpath *)&i_1);
      Subpath::~Subpath((Subpath *)&i_1);
      pvVar5 = std::vector<Point,_std::allocator<Point>_>::front
                         ((vector<Point,_std::allocator<Point>_> *)new_subpath._24_8_);
      pvVar6 = std::vector<Point,_std::allocator<Point>_>::back
                         ((vector<Point,_std::allocator<Point>_> *)new_subpath._24_8_);
      Subpath::push_offset_segment((Subpath *)&i,pvVar5,pvVar6,offset_00);
    }
    sVar4 = std::vector<Point,_std::allocator<Point>_>::size
                      ((vector<Point,_std::allocator<Point>_> *)new_subpath._24_8_);
    while (local_c0 = sVar4 - 1, local_c0 != 0) {
      pvVar5 = std::vector<Point,_std::allocator<Point>_>::operator[]
                         ((vector<Point,_std::allocator<Point>_> *)new_subpath._24_8_,local_c0);
      pvVar6 = std::vector<Point,_std::allocator<Point>_>::operator[]
                         ((vector<Point,_std::allocator<Point>_> *)new_subpath._24_8_,sVar4 - 2);
      Subpath::push_offset_segment((Subpath *)&i,pvVar5,pvVar6,offset_00);
      sVar4 = local_c0;
    }
    new_subpath.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
    fill_subpath(this,(Subpath *)&i,shape_00);
    Subpath::~Subpath((Subpath *)&i);
    __gnu_cxx::__normal_iterator<const_Subpath_*,_std::vector<Subpath,_std::allocator<Subpath>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void stroke(std::vector<Shape>& shapes, float width, const std::shared_ptr<Paint>& paint) const {
		shapes.emplace_back(paint);
		Shape& shape = shapes.back();
		const float offset = width / 2.f;
		for (const Subpath& subpath: subpaths) {
			const std::vector<Point>& points = subpath.points;
			Subpath new_subpath;
			for (size_t i = 1; i < points.size(); ++i) {
				new_subpath.push_offset_segment(points[i-1], points[i], offset);
			}
			if (subpath.closed) {
				new_subpath.push_offset_segment(points.back(), points.front(), offset);
				new_subpath.closed = true;
				fill_subpath(new_subpath, shape);
				new_subpath = Subpath();
				new_subpath.push_offset_segment(points.front(), points.back(), offset);
			}
			for (size_t i = points.size() - 1; i > 0; --i) {
				new_subpath.push_offset_segment(points[i], points[i-1], offset);
			}
			new_subpath.closed = true;
			fill_subpath(new_subpath, shape);
		}
	}